

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall cfd::core::Address::CalculateP2SH(Address *this,uint8_t prefix)

{
  ByteData160 script_hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  Script::GetData((ByteData *)&local_60,&this->redeem_script_);
  HashUtil::Hash160((ByteData160 *)&local_48,(ByteData *)&local_60);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  CalculateP2SH(this,(ByteData160 *)&local_48,prefix);
  ByteData160::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,
             (ByteData160 *)&local_48);
  ByteData::ByteData((ByteData *)&local_60,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  ByteData::operator=(&this->hash_,(ByteData *)&local_60);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void Address::CalculateP2SH(uint8_t prefix) {
  // create script hash.
  ByteData160 script_hash = HashUtil::Hash160(redeem_script_.GetData());
  CalculateP2SH(script_hash, prefix);
  hash_ = ByteData(script_hash.GetBytes());
}